

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O1

void __thiscall ImVector<ImDrawCmd>::push_front(ImVector<ImDrawCmd> *this,ImDrawCmd *v)

{
  int iVar1;
  int iVar2;
  ImTextureID pvVar3;
  ImDrawCallback p_Var4;
  undefined4 uVar5;
  uint uVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  ImDrawCmd *pIVar12;
  int iVar13;
  int iVar14;
  
  iVar1 = this->Size;
  if (iVar1 == 0) {
    if (this->Capacity == 0) {
      pIVar12 = (ImDrawCmd *)ImGui::MemAlloc(0x1c0);
      if (this->Data != (ImDrawCmd *)0x0) {
        memcpy(pIVar12,this->Data,(long)this->Size * 0x38);
        ImGui::MemFree(this->Data);
      }
      this->Data = pIVar12;
      this->Capacity = 8;
    }
    pIVar12 = this->Data + this->Size;
  }
  else {
    iVar2 = this->Capacity;
    if (iVar1 == iVar2) {
      if (iVar2 == 0) {
        iVar13 = 8;
      }
      else {
        iVar13 = iVar2 / 2 + iVar2;
      }
      iVar14 = iVar1 + 1;
      if (iVar1 + 1 < iVar13) {
        iVar14 = iVar13;
      }
      if (iVar2 < iVar14) {
        pIVar12 = (ImDrawCmd *)ImGui::MemAlloc((long)iVar14 * 0x38);
        if (this->Data != (ImDrawCmd *)0x0) {
          memcpy(pIVar12,this->Data,(long)this->Size * 0x38);
          ImGui::MemFree(this->Data);
        }
        this->Data = pIVar12;
        this->Capacity = iVar14;
      }
    }
    if (0 < (long)this->Size) {
      memmove(this->Data + 1,this->Data,(long)this->Size * 0x38);
    }
    pIVar12 = this->Data;
  }
  pIVar12->UserCallbackData = v->UserCallbackData;
  fVar8 = (v->ClipRect).x;
  fVar9 = (v->ClipRect).y;
  fVar10 = (v->ClipRect).z;
  fVar11 = (v->ClipRect).w;
  pvVar3 = v->TextureId;
  uVar6 = v->VtxOffset;
  uVar7 = v->IdxOffset;
  uVar5 = *(undefined4 *)&v->field_0x24;
  p_Var4 = v->UserCallback;
  pIVar12->ElemCount = v->ElemCount;
  *(undefined4 *)&pIVar12->field_0x24 = uVar5;
  pIVar12->UserCallback = p_Var4;
  pIVar12->TextureId = pvVar3;
  pIVar12->VtxOffset = uVar6;
  pIVar12->IdxOffset = uVar7;
  (pIVar12->ClipRect).x = fVar8;
  (pIVar12->ClipRect).y = fVar9;
  (pIVar12->ClipRect).z = fVar10;
  (pIVar12->ClipRect).w = fVar11;
  this->Size = this->Size + 1;
  return;
}

Assistant:

inline void         push_front(const T& v)              { if (Size == 0) push_back(v); else insert(Data, v); }